

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBddIte.c
# Opt level: O0

DdNode * Cudd_bddIteConstant(DdManager *dd,DdNode *f,DdNode *g,DdNode *h)

{
  uint local_b8;
  uint local_b4;
  bool local_a5;
  uint local_a4;
  uint local_a0;
  uint v;
  uint toph;
  uint topg;
  uint topf;
  int comple;
  DdNode *zero;
  DdNode *one;
  DdNode *e;
  DdNode *t;
  DdNode *Hnv;
  DdNode *Hv;
  DdNode *H;
  DdNode *Gnv;
  DdNode *Gv;
  DdNode *Fnv;
  DdNode *Fv;
  DdNode *r;
  DdNode *h_local;
  DdNode *g_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  zero = dd->one;
  _topf = (DdNode *)((ulong)zero ^ 1);
  dd_local = (DdManager *)g;
  if ((f != zero) && (dd_local = (DdManager *)h, f != _topf)) {
    r = h;
    h_local = g;
    g_local = f;
    f_local = &dd->sentinel;
    bddVarToConst(f,&h_local,&r,zero);
    if (h_local == r) {
      dd_local = (DdManager *)h_local;
    }
    else if ((*(int *)((ulong)h_local & 0xfffffffffffffffe) == 0x7fffffff) &&
            (*(int *)((ulong)r & 0xfffffffffffffffe) == 0x7fffffff)) {
      dd_local = (DdManager *)0x1;
    }
    else if (h_local == (DdNode *)((ulong)r ^ 1)) {
      dd_local = (DdManager *)0x1;
    }
    else {
      topg = bddVarToCanonical((DdManager *)f_local,&g_local,&h_local,&r,&toph,&v,&local_a0);
      Fv = cuddConstantLookup((DdManager *)f_local,0x6a,g_local,h_local,r);
      if (Fv == (DdNode *)0x0) {
        if (local_a0 < v) {
          local_b4 = local_a0;
        }
        else {
          local_b4 = v;
        }
        local_a4 = local_b4;
        if (((toph < local_b4) && ((g_local->type).kids.T == zero)) &&
           ((g_local->type).kids.E == _topf)) {
          dd_local = (DdManager *)0x1;
        }
        else {
          if (local_b4 < toph) {
            Gv = g_local;
            Fnv = g_local;
          }
          else {
            if (local_b4 < toph) {
              local_b8 = local_b4;
            }
            else {
              local_b8 = toph;
            }
            local_a4 = local_b8;
            Fnv = (g_local->type).kids.T;
            Gv = (g_local->type).kids.E;
          }
          if (v == local_a4) {
            Gnv = (h_local->type).kids.T;
            H = (h_local->type).kids.E;
          }
          else {
            H = h_local;
            Gnv = h_local;
          }
          if (local_a0 == local_a4) {
            Hv = (DdNode *)((ulong)r & 0xfffffffffffffffe);
            Hnv = (Hv->type).kids.T;
            t = (Hv->type).kids.E;
            if (((ulong)r & 1) != 0) {
              Hnv = (DdNode *)((ulong)Hnv ^ 1);
              t = (DdNode *)((ulong)t ^ 1);
            }
          }
          else {
            t = r;
            Hnv = r;
          }
          e = Cudd_bddIteConstant((DdManager *)f_local,Fnv,Gnv,Hnv);
          if ((e == (DdNode *)0x1) || (*(int *)((ulong)e & 0xfffffffffffffffe) != 0x7fffffff)) {
            cuddCacheInsert((DdManager *)f_local,0x6a,g_local,h_local,r,(DdNode *)0x1);
            dd_local = (DdManager *)0x1;
          }
          else {
            one = Cudd_bddIteConstant((DdManager *)f_local,Gv,H,t);
            if (((one == (DdNode *)0x1) || (*(int *)((ulong)one & 0xfffffffffffffffe) != 0x7fffffff)
                ) || (e != one)) {
              cuddCacheInsert((DdManager *)f_local,0x6a,g_local,h_local,r,(DdNode *)0x1);
              dd_local = (DdManager *)0x1;
            }
            else {
              cuddCacheInsert((DdManager *)f_local,0x6a,g_local,h_local,r,e);
              dd_local = (DdManager *)((ulong)e ^ (long)(int)topg);
            }
          }
        }
      }
      else {
        local_a5 = topg != 0 && Fv != (DdNode *)0x1;
        dd_local = (DdManager *)((ulong)Fv ^ (long)(int)(uint)local_a5);
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
Cudd_bddIteConstant(
  DdManager * dd,
  DdNode * f,
  DdNode * g,
  DdNode * h)
{
    DdNode       *r, *Fv, *Fnv, *Gv, *Gnv, *H, *Hv, *Hnv, *t, *e;
    DdNode       *one = DD_ONE(dd);
    DdNode       *zero = Cudd_Not(one);
    int          comple;
    unsigned int topf, topg, toph, v;

    statLine(dd);
    /* Trivial cases. */
    if (f == one)                       /* ITE(1,G,H) => G */
        return(g);
    
    if (f == zero)                      /* ITE(0,G,H) => H */
        return(h);
    
    /* f now not a constant. */
    bddVarToConst(f, &g, &h, one);      /* possibly convert g or h */
                                        /* to constants */

    if (g == h)                         /* ITE(F,G,G) => G */
        return(g);

    if (Cudd_IsConstant(g) && Cudd_IsConstant(h)) 
        return(DD_NON_CONSTANT);        /* ITE(F,1,0) or ITE(F,0,1) */
                                        /* => DD_NON_CONSTANT */
    
    if (g == Cudd_Not(h))
        return(DD_NON_CONSTANT);        /* ITE(F,G,G') => DD_NON_CONSTANT */
                                        /* if F != G and F != G' */
    
    comple = bddVarToCanonical(dd, &f, &g, &h, &topf, &topg, &toph);

    /* Cache lookup. */
    r = cuddConstantLookup(dd, DD_BDD_ITE_CONSTANT_TAG, f, g, h);
    if (r != NULL) {
        return(Cudd_NotCond(r,comple && r != DD_NON_CONSTANT));
    }

    v = ddMin(topg, toph);

    /* ITE(F,G,H) = (v,G,H) (non constant) if F = (v,1,0), v < top(G,H). */
    if (topf < v && cuddT(f) == one && cuddE(f) == zero) {
        return(DD_NON_CONSTANT);
    }

    /* Compute cofactors. */
    if (topf <= v) {
        v = ddMin(topf, v);             /* v = top_var(F,G,H) */
        Fv = cuddT(f); Fnv = cuddE(f);
    } else {
        Fv = Fnv = f;
    }

    if (topg == v) {
        Gv = cuddT(g); Gnv = cuddE(g);
    } else {
        Gv = Gnv = g;
    }

    if (toph == v) {
        H = Cudd_Regular(h);
        Hv = cuddT(H); Hnv = cuddE(H);
        if (Cudd_IsComplement(h)) {
            Hv = Cudd_Not(Hv);
            Hnv = Cudd_Not(Hnv);
        }
    } else {
        Hv = Hnv = h;
    }

    /* Recursion. */
    t = Cudd_bddIteConstant(dd, Fv, Gv, Hv);
    if (t == DD_NON_CONSTANT || !Cudd_IsConstant(t)) {
        cuddCacheInsert(dd, DD_BDD_ITE_CONSTANT_TAG, f, g, h, DD_NON_CONSTANT);
        return(DD_NON_CONSTANT);
    }
    e = Cudd_bddIteConstant(dd, Fnv, Gnv, Hnv);
    if (e == DD_NON_CONSTANT || !Cudd_IsConstant(e) || t != e) {
        cuddCacheInsert(dd, DD_BDD_ITE_CONSTANT_TAG, f, g, h, DD_NON_CONSTANT);
        return(DD_NON_CONSTANT);
    }
    cuddCacheInsert(dd, DD_BDD_ITE_CONSTANT_TAG, f, g, h, t);
    return(Cudd_NotCond(t,comple));

}